

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

unique_ptr<Catch::AutomakeReporter> __thiscall
Catch::Detail::make_unique<Catch::AutomakeReporter,Catch::ReporterConfig>
          (Detail *this,ReporterConfig *args)

{
  AutomakeReporter *this_00;
  ReporterConfig *args_local;
  
  this_00 = (AutomakeReporter *)operator_new(0x90);
  AutomakeReporter::AutomakeReporter(this_00,args);
  unique_ptr<Catch::AutomakeReporter>::unique_ptr
            ((unique_ptr<Catch::AutomakeReporter> *)this,this_00);
  return (unique_ptr<Catch::AutomakeReporter>)(AutomakeReporter *)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }